

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O3

void http_on_response_handler______internal(http_s *h,http_settings_s *settings)

{
  uint64_t key_hash;
  char cVar1;
  FIOBJ FVar2;
  fiobj_object_vtable_s *pfVar3;
  uint uVar4;
  fio_str_info_s val;
  fio_str_info_s local_28;
  
  if (http_upgrade_hash == 0) {
    http_upgrade_hash = fio_siphash13("upgrade",7,0x1456f2,0x145bc9);
  }
  key_hash = http_upgrade_hash;
  h->udata = settings->udata;
  FVar2 = fiobj_hash_get2(h->headers,key_hash);
  if (FVar2 == 0) {
    (*settings->on_response)(h);
    return;
  }
  cVar1 = (char)FVar2;
  if ((FVar2 & 1) != 0) {
    fio_ltocstr(&local_28,(long)FVar2 >> 1);
    goto LAB_00152cbd;
  }
  switch((uint)FVar2 & 6) {
  case 0:
    cVar1 = *(char *)(FVar2 & 0xfffffffffffffff8);
LAB_00152c5c:
    switch(cVar1) {
    case '\'':
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_00152c51_caseD_2;
    case ')':
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_00152c51_caseD_4;
    case '+':
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_00152c51_caseD_2:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_00152c51_caseD_4:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar1 == '&') {
      local_28.data = anon_var_dwarf_217;
      local_28.len._0_4_ = 5;
    }
    else {
      uVar4 = (uint)FVar2 & 0xff;
      if (uVar4 == 0x16) {
        local_28.data = anon_var_dwarf_222;
        local_28.len._0_4_ = 4;
      }
      else {
        if (uVar4 != 6) goto LAB_00152c5c;
        local_28.data = anon_var_dwarf_20c;
        local_28.len._0_4_ = 4;
      }
    }
    local_28.len._4_4_ = 0;
    local_28.capa._4_4_ = 0;
    local_28.capa._0_4_ = 0;
    goto LAB_00152cbd;
  }
  (*pfVar3->to_str)(&local_28,FVar2);
LAB_00152cbd:
  (*settings->on_upgrade)(h,local_28.data,CONCAT44(local_28.len._4_4_,(undefined4)local_28.len));
  return;
}

Assistant:

void http_on_response_handler______internal(http_s *h,
                                            http_settings_s *settings) {
  if (!http_upgrade_hash)
    http_upgrade_hash = fiobj_hash_string("upgrade", 7);
  h->udata = settings->udata;
  FIOBJ t = fiobj_hash_get2(h->headers, http_upgrade_hash);
  if (t == FIOBJ_INVALID) {
    settings->on_response(h);
    return;
  } else {
    fio_str_info_s val = fiobj_obj2cstr(t);
    settings->on_upgrade(h, val.data, val.len);
  }
}